

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rle.cpp
# Opt level: O2

void __thiscall
duckdb::RLECompressState<double,_true>::WriteValue
          (RLECompressState<double,_true> *this,double value,rle_count_t count,bool is_null)

{
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *this_00;
  atomic<unsigned_long> *paVar1;
  idx_t iVar2;
  idx_t iVar3;
  __int_type _Var4;
  data_ptr_t pdVar5;
  pointer pCVar6;
  undefined7 in_register_00000011;
  
  pdVar5 = BufferHandle::Ptr(&this->handle);
  iVar2 = this->entry_count;
  iVar3 = this->max_rle_count;
  *(double *)(pdVar5 + iVar2 * 8 + 8) = value;
  *(rle_count_t *)(pdVar5 + iVar2 * 2 + iVar3 * 8 + 8) = count;
  this->entry_count = iVar2 + 1;
  if ((int)CONCAT71(in_register_00000011,is_null) == 0) {
    pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(&this->current_segment);
    NumericStats::Update<double>(&(pCVar6->stats).statistics.stats_union.numeric_data,value);
  }
  this_00 = &this->current_segment;
  pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->(this_00);
  LOCK();
  paVar1 = &(pCVar6->super_SegmentBase<duckdb::ColumnSegment>).count;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + (ulong)count;
  UNLOCK();
  if (this->entry_count == this->max_rle_count) {
    pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this_00);
    iVar2 = (pCVar6->super_SegmentBase<duckdb::ColumnSegment>).start;
    pCVar6 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
             operator->(this_00);
    _Var4 = (pCVar6->super_SegmentBase<duckdb::ColumnSegment>).count.
            super___atomic_base<unsigned_long>._M_i;
    FlushSegment(this);
    CreateEmptySegment(this,_Var4 + iVar2);
    this->entry_count = 0;
  }
  return;
}

Assistant:

void WriteValue(T value, rle_count_t count, bool is_null) {
		// write the RLE entry
		auto handle_ptr = handle.Ptr() + RLEConstants::RLE_HEADER_SIZE;
		auto data_pointer = reinterpret_cast<T *>(handle_ptr);
		auto index_pointer = reinterpret_cast<rle_count_t *>(handle_ptr + max_rle_count * sizeof(T));
		data_pointer[entry_count] = value;
		index_pointer[entry_count] = count;
		entry_count++;

		// update meta data
		if (WRITE_STATISTICS && !is_null) {
			current_segment->stats.statistics.UpdateNumericStats<T>(value);
		}
		current_segment->count += count;

		if (entry_count == max_rle_count) {
			// we have finished writing this segment: flush it and create a new segment
			auto row_start = current_segment->start + current_segment->count;
			FlushSegment();
			CreateEmptySegment(row_start);
			entry_count = 0;
		}
	}